

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::recalculateLoci
          (HierarchicalTaskNetworkComponent *this,
          vector<int,_std::allocator<int>_> *updatedLociIndices)

{
  int iVar1;
  pointer pFVar2;
  undefined8 *puVar3;
  pointer pEVar4;
  bool bVar5;
  float fVar6;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float local_90;
  float local_8c;
  Vector3 local_88;
  Vector3 local_78;
  float local_68;
  float local_64;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range2;
  HierarchicalTaskNetworkComponent *local_58;
  int *local_50;
  int *local_48;
  pointer local_40;
  ulong local_38;
  
  local_50 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_58 = this;
  for (local_48 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; local_48 != local_50; local_48 = local_48 + 1) {
    iVar1 = *local_48;
    pFVar2 = (local_58->state).memory.focusLocus.
             super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
             super__Vector_impl_data._M_start;
    __range2 = &pFVar2[iVar1].engrams;
    puVar3 = *(undefined8 **)
              &pFVar2[iVar1].engrams.super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
               _M_impl;
    local_40 = *(pointer *)
                ((long)&pFVar2[iVar1].engrams.
                        super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl + 8);
    lVar10 = 0;
    local_8c = 0.0;
    local_90 = 0.0;
    local_64 = 0.0;
    uVar9 = 0;
    while( true ) {
      if ((pointer)(lVar10 + (long)puVar3) == local_40) break;
      local_78._0_8_ = *puVar3;
      local_78.z = 0.0;
      local_88._0_8_ = *(undefined8 *)((long)puVar3 + lVar10);
      local_88.z = 0.0;
      fVar11 = Math::distanceSquared(&local_78,&local_88);
      local_68 = *(float *)((long)puVar3 + lVar10 + 8);
      local_8c = fmaxf(local_8c,local_68);
      pvVar7 = __range2;
      if (lVar10 != 0) {
        pEVar4 = (__range2->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_78._0_8_ = *(undefined8 *)((long)&(pEVar4->stimulus).x + lVar10);
        local_78.z = 0.0;
        local_88._0_8_ = *(undefined8 *)((long)&pEVar4[-1].stimulus.x + lVar10);
        local_88.z = 0.0;
        local_38 = uVar9;
        fVar12 = Math::distanceSquared(&local_78,&local_88);
        pEVar4 = (pvVar7->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar6 = (float)(*(int *)((long)pEVar4 + lVar10 + -4) - *(int *)((long)&pEVar4->age + lVar10)
                       );
        if (fVar6 <= 1.0) {
          fVar6 = 1.0;
        }
        local_90 = local_90 + fVar12 / fVar6;
        uVar9 = local_38;
      }
      uVar9 = (ulong)((int)uVar9 + (uint)(10000.0 < fVar11));
      local_64 = local_64 + local_68;
      lVar10 = lVar10 + 0x30;
    }
    uVar8 = ((long)(__range2->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(__range2->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x30;
    bVar5 = uVar8 <= (uint)((int)uVar9 * 2);
    if (bVar5) {
      local_8c = local_64 / (float)(long)uVar8 + local_90 / (float)(uVar8 - 1);
    }
    else {
      *(undefined4 *)
       &__range2[1].super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
        super__Vector_impl_data._M_start = 0x42c80000;
    }
    *(uint *)((long)&__range2[1].super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl
                     .super__Vector_impl_data._M_start + 4) = (uint)bVar5;
    *(float *)((long)&__range2[1].super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 4) = local_8c;
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::recalculateLoci(std::vector<int> updatedLociIndices)
{
	const float maxDistanceToOrigin = 100.f * 100.f;
	
	for(auto id : updatedLociIndices)
	{
		//if all engrams are within a certain radius of the starting one, its an area loci
		//otherwise, its path
		auto& locus = state.memory.focusLocus[id];
		auto& origin = locus.engrams[0];
		unsigned int pastDistanceCount = 0;
		float maxDistance = maxDistanceToOrigin;
		float averageIntensity = 0.f;
		float maxIntensity = 0.f;
		float averageSpeed = 0.f;

		int i = 0;
		for (auto& engram : locus.engrams)
		{
			auto distance = distanceSquared({origin.stimulus.x, origin.stimulus.y, 0.f}, {engram.stimulus.x, engram.stimulus.y, 0.f});

			if (distance > maxDistanceToOrigin)
			{
				pastDistanceCount++;
			}

			maxDistance = fmax(maxDistance, distance);

			maxIntensity = fmax(maxIntensity, engram.stimulus.intensity);
			averageIntensity += engram.stimulus.intensity;

			if (i > 0)
			{
				auto speed = 
					distanceSquared(
						{locus.engrams[i].stimulus.x, locus.engrams[i].stimulus.y, 0.f},
						{locus.engrams[i - 1].stimulus.x, locus.engrams[i - 1].stimulus.y, 0.f})
					/ fmax(locus.engrams[i - 1].age - locus.engrams[i].age, 1);

				averageSpeed += speed;
			}

			i++;
		}

		averageIntensity /= locus.engrams.size();
		averageSpeed /= (locus.engrams.size() - 1);

		if (pastDistanceCount * 2u >= locus.engrams.size())
		{
			locus.type = FocusLocusType::Path;
			locus.currentImportance = averageIntensity + averageSpeed;
		}
		else
		{
			locus.type = FocusLocusType::Area;
			locus.area.radius = 100.f;
			locus.currentImportance = maxIntensity;
		}	
	}
}